

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::are_equal<unsigned_char,8ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (uchar (*expected) [8],vector<unsigned_char,_std::allocator<unsigned_char>_> *actual,
               LocationInfo *location)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *p_Var1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__first1;
  bool value;
  const_iterator cVar2;
  const_iterator __last;
  unsigned_long local_30 [2];
  LocationInfo *local_20;
  LocationInfo *location_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *actual_local;
  uchar (*expected_local) [8];
  
  local_30[1] = 8;
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)expected;
  cVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(actual);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)location_local);
  local_30[0] = std::
                distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )cVar2._M_current,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )__last._M_current);
  are_equal<unsigned_long,unsigned_long>(local_30 + 1,local_30,local_20);
  __first1 = actual_local;
  p_Var1 = &actual_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  cVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)location_local);
  value = std::
          equal<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((uchar *)__first1,(uchar *)&(p_Var1->_M_impl).super__Vector_impl_data._M_finish
                     ,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       )cVar2._M_current);
  is_true(value,local_20);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}